

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O2

void __thiscall fp::Algorithm::Algorithm(Algorithm *this)

{
  long lVar1;
  stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
  *psVar2;
  stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
  *psVar3;
  long lVar4;
  
  this->path_found_ = false;
  this->need_newpath_ = true;
  this->temp_goal_ = false;
  this->path_blocked = true;
  this->visited_Count = 0;
  Maze::Maze(&this->maze_info);
  this->current_direction_ = 'N';
  this->block_direction_ = '\0';
  *(undefined8 *)(this->current_node_)._M_elems = 0;
  *(undefined8 *)(this->parent_node_)._M_elems = 0;
  std::
  stack<std::array<int,2ul>,std::deque<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>>::
  stack<std::deque<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>,void>(&this->stack_);
  (this->robot_).super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->robot_).super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  stack<std::array<int,2ul>,std::deque<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>>::
  stack<std::deque<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>,void>
            (&this->path_stack_);
  std::array<std::array<fp::Node,_16UL>,_16UL>::array(&this->node_info);
  memset(&this->node_master_,0,0x6000);
  psVar3 = &(this->node_info)._M_elems[0xf]._M_elems[0xf].child_node_;
  lVar1 = 0x64d0;
  do {
    lVar1 = lVar1 + 0x600;
    lVar4 = 0x600;
    psVar2 = psVar3;
    do {
      Node::Node((Node *)(psVar2 + 1));
      psVar2 = (stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
                *)((long)(psVar2 + 1) + 0x10);
      lVar4 = lVar4 + -0x60;
    } while (lVar4 != 0);
    psVar3 = (stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
              *)((long)(psVar3 + 0x13) + 0x10);
  } while (lVar1 != 0xc4d0);
  memset(&this->explored_node_,0,0x200);
  *(undefined8 *)(this->goal1_)._M_elems = 0x700000008;
  *(undefined8 *)(this->goal2_)._M_elems = 0x800000008;
  *(undefined8 *)(this->goal3_)._M_elems = 0x800000007;
  *(undefined8 *)(this->goal4_)._M_elems = 0x700000007;
  *(undefined8 *)(this->end_goal_)._M_elems = 0;
  return;
}

Assistant:

Algorithm() : path_found_{false}, need_newpath_{true}, current_direction_{'N'}, goal1_{8, 7},
                      goal2_{8, 8}, goal3_{7, 8}, goal4_{7, 7},
                      end_goal_{}, current_node_{}, block_direction_{}, stack_{}, path_stack_{}, parent_node_{},
                      visited_node_{}, node_master_{}, explored_node_{}, robot_{nullptr} {

        }